

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O2

void __thiscall density::lifo_array<MyStruct>::~lifo_array(lifo_array<MyStruct> *this)

{
  MyStruct *pMVar1;
  MyStruct *this_00;
  
  pMVar1 = (this->super_LifoArrayImpl<MyStruct,_false>).m_elements;
  this_00 = pMVar1 + (this->super_LifoArrayImpl<MyStruct,_false>).m_size;
  while (this_00 = this_00 + -1, pMVar1 <= this_00) {
    density_tests::lifo_array_example_2::MyStruct::~MyStruct(this_00);
    pMVar1 = (this->super_LifoArrayImpl<MyStruct,_false>).m_elements;
  }
  detail::LifoArrayImpl<MyStruct,_false>::~LifoArrayImpl
            (&this->super_LifoArrayImpl<MyStruct,_false>);
  return;
}

Assistant:

~lifo_array() { destroy_elements(std::is_trivially_destructible<TYPE>()); }